

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.cpp
# Opt level: O3

Ref<embree::SceneGraph::Node> __thiscall
embree::SceneGraph::convert_flat_to_round_curves
          (SceneGraph *this,Ref<embree::SceneGraph::Node> *node)

{
  int iVar1;
  Node *pNVar2;
  long *plVar3;
  undefined4 uVar4;
  long *plVar5;
  long lVar6;
  ulong uVar7;
  long local_50;
  Ref<embree::SceneGraph::Node> local_48;
  Ref<embree::SceneGraph::Node> local_40;
  Ref<embree::SceneGraph::Node> local_38;
  
  pNVar2 = node->ptr;
  if (pNVar2 == (Node *)0x0) {
LAB_00151408:
    *(Node **)this = node->ptr;
    node->ptr = (Node *)0x0;
    return (Ref<embree::SceneGraph::Node>)(Node *)this;
  }
  plVar5 = (long *)__dynamic_cast(pNVar2,&Node::typeinfo,&TransformNode::typeinfo,0);
  if (plVar5 != (long *)0x0) {
    (**(code **)(*plVar5 + 0x10))(plVar5);
    local_38.ptr = (Node *)plVar5[0x13];
    if (local_38.ptr != (Node *)0x0) {
      (*((local_38.ptr)->super_RefCount)._vptr_RefCount[2])();
    }
    convert_flat_to_round_curves((SceneGraph *)&local_50,&local_38);
    if ((long *)plVar5[0x13] != (long *)0x0) {
      (**(code **)(*(long *)plVar5[0x13] + 0x18))();
    }
    plVar5[0x13] = local_50;
    if (local_38.ptr != (Node *)0x0) {
      (*((local_38.ptr)->super_RefCount)._vptr_RefCount[3])();
    }
    (**(code **)(*plVar5 + 0x18))(plVar5);
    goto LAB_00151408;
  }
  plVar5 = (long *)__dynamic_cast(pNVar2,&Node::typeinfo,&MultiTransformNode::typeinfo,0);
  if (plVar5 != (long *)0x0) {
    (**(code **)(*plVar5 + 0x10))(plVar5);
    local_40.ptr = (Node *)plVar5[0x10];
    if (local_40.ptr != (Node *)0x0) {
      (*((local_40.ptr)->super_RefCount)._vptr_RefCount[2])();
    }
    convert_flat_to_round_curves((SceneGraph *)&local_50,&local_40);
    if ((long *)plVar5[0x10] != (long *)0x0) {
      (**(code **)(*(long *)plVar5[0x10] + 0x18))();
    }
    plVar5[0x10] = local_50;
    if (local_40.ptr != (Node *)0x0) {
      (*((local_40.ptr)->super_RefCount)._vptr_RefCount[3])();
    }
    (**(code **)(*plVar5 + 0x18))(plVar5);
    goto LAB_00151408;
  }
  plVar5 = (long *)__dynamic_cast(pNVar2,&Node::typeinfo,&GroupNode::typeinfo,0);
  if (plVar5 != (long *)0x0) {
    (**(code **)(*plVar5 + 0x10))(plVar5);
    lVar6 = plVar5[0xd];
    if (plVar5[0xe] != lVar6) {
      uVar7 = 0;
      do {
        local_48.ptr = *(Node **)(lVar6 + uVar7 * 8);
        if (local_48.ptr != (Node *)0x0) {
          (*((local_48.ptr)->super_RefCount)._vptr_RefCount[2])();
        }
        convert_flat_to_round_curves((SceneGraph *)&local_50,&local_48);
        lVar6 = plVar5[0xd];
        plVar3 = *(long **)(lVar6 + uVar7 * 8);
        if (plVar3 != (long *)0x0) {
          (**(code **)(*plVar3 + 0x18))();
        }
        *(long *)(lVar6 + uVar7 * 8) = local_50;
        if (local_48.ptr != (Node *)0x0) {
          (*((local_48.ptr)->super_RefCount)._vptr_RefCount[3])();
        }
        uVar7 = uVar7 + 1;
        lVar6 = plVar5[0xd];
      } while (uVar7 < (ulong)(plVar5[0xe] - lVar6 >> 3));
    }
    (**(code **)(*plVar5 + 0x18))(plVar5);
    goto LAB_00151408;
  }
  plVar5 = (long *)__dynamic_cast(pNVar2,&Node::typeinfo,&HairSetNode::typeinfo,0);
  if (plVar5 == (long *)0x0) goto LAB_00151408;
  (**(code **)(*plVar5 + 0x10))(plVar5);
  iVar1 = (int)plVar5[0xe];
  if (iVar1 == 0x11) {
    uVar4 = 0x10;
  }
  else if (iVar1 == 0x19) {
    uVar4 = 0x18;
  }
  else {
    if (iVar1 != 0x21) goto LAB_0015147a;
    uVar4 = 0x20;
  }
  *(undefined4 *)(plVar5 + 0xe) = uVar4;
LAB_0015147a:
  *(long **)this = plVar5;
  (**(code **)(*plVar5 + 0x10))(plVar5);
  (**(code **)(*plVar5 + 0x18))(plVar5);
  return (Ref<embree::SceneGraph::Node>)(Node *)this;
}

Assistant:

Ref<SceneGraph::Node> SceneGraph::convert_flat_to_round_curves(Ref<SceneGraph::Node> node)
  {
    if (Ref<SceneGraph::TransformNode> xfmNode = node.dynamicCast<SceneGraph::TransformNode>()) {
      xfmNode->child = convert_flat_to_round_curves(xfmNode->child);
    }
    else if (Ref<SceneGraph::MultiTransformNode> xfmNode = node.dynamicCast<SceneGraph::MultiTransformNode>()) {
      xfmNode->child = convert_flat_to_round_curves(xfmNode->child);
    }
    else if (Ref<SceneGraph::GroupNode> groupNode = node.dynamicCast<SceneGraph::GroupNode>()) 
    {
      for (size_t i=0; i<groupNode->children.size(); i++) 
        groupNode->children[i] = convert_flat_to_round_curves(groupNode->children[i]);
    }
    else if (Ref<SceneGraph::HairSetNode> hmesh = node.dynamicCast<SceneGraph::HairSetNode>()) 
    {
      if (hmesh->type == RTC_GEOMETRY_TYPE_FLAT_LINEAR_CURVE)
        hmesh->type = RTC_GEOMETRY_TYPE_ROUND_LINEAR_CURVE;
      else if (hmesh->type == RTC_GEOMETRY_TYPE_FLAT_BEZIER_CURVE)
        hmesh->type = RTC_GEOMETRY_TYPE_ROUND_BEZIER_CURVE;
      else if (hmesh->type == RTC_GEOMETRY_TYPE_FLAT_BSPLINE_CURVE)
        hmesh->type = RTC_GEOMETRY_TYPE_ROUND_BSPLINE_CURVE;

      return hmesh.dynamicCast<SceneGraph::Node>();
    }
    return node;
  }